

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getRows(Highs *this,HighsInt *mask,HighsInt *num_row,double *lower,double *upper,
              HighsInt *num_nz,HighsInt *start,HighsInt *index,double *value)

{
  Highs *in_R9;
  HighsInt *unaff_retaddr;
  HighsInt *in_stack_00000008;
  HighsIndexCollection *in_stack_00000010;
  bool create_error;
  HighsIndexCollection index_collection;
  HighsIndexCollection *in_stack_ffffffffffffff40;
  HighsInt in_stack_ffffffffffffff7c;
  HighsInt *in_stack_ffffffffffffff80;
  HighsIndexCollection *in_stack_ffffffffffffff88;
  HighsInt *in_stack_ffffffffffffffa8;
  double *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  HighsInt *in_stack_ffffffffffffffc0;
  HighsIndexCollection *in_stack_ffffffffffffffc8;
  
  HighsIndexCollection::HighsIndexCollection(in_stack_ffffffffffffff40);
  create(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  getRowsInterface(in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   unaff_retaddr,in_stack_00000008,(double *)in_stack_00000010);
  HighsIndexCollection::~HighsIndexCollection(in_stack_00000010);
  return kOk;
}

Assistant:

HighsStatus Highs::getRows(const HighsInt* mask, HighsInt& num_row,
                           double* lower, double* upper, HighsInt& num_nz,
                           HighsInt* start, HighsInt* index,
                           double* value) const {
  HighsIndexCollection index_collection;
  const bool create_error = create(index_collection, mask, model_.lp_.num_row_);
  assert(!create_error);
  (void)create_error;
  getRowsInterface(index_collection, num_row, lower, upper, num_nz, start,
                   index, value);
  return HighsStatus::kOk;
}